

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,IStringFromParts *parts)

{
  ValueLength VVar1;
  ulong uVar2;
  long lVar3;
  size_type sVar4;
  Builder *this_00;
  const_pointer __src;
  long *in_RSI;
  Builder *in_RDI;
  string_view part;
  size_t size;
  size_t idx;
  uint64_t length;
  ValueLength oldPos;
  undefined7 in_stack_ffffffffffffff98;
  uint8_t in_stack_ffffffffffffff9f;
  Builder *in_stack_ffffffffffffffa0;
  ValueLength in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb8;
  Builder *in_stack_ffffffffffffffc0;
  long local_30;
  
  VVar1 = in_RDI->_pos;
  checkKeyHasValidType(in_stack_ffffffffffffffc0,SUB81(in_stack_ffffffffffffffb8 >> 0x38,0));
  uVar2 = (**(code **)(*in_RSI + 0x18))();
  if (uVar2 < 0x7f) {
    reserve(in_RDI,in_stack_ffffffffffffffa8);
    appendByteUnchecked(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  }
  else {
    reserve(in_RDI,in_stack_ffffffffffffffa8);
    appendByteUnchecked(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
    appendLengthUnchecked<8ul>(in_RDI,in_stack_ffffffffffffffa8);
  }
  local_30 = 0;
  lVar3 = (**(code **)(*in_RSI + 0x10))();
  for (; local_30 != lVar3; local_30 = local_30 + 1) {
    (**(code **)(*in_RSI + 0x20))(in_RSI,local_30);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffb8)
    ;
    if (sVar4 != 0) {
      this_00 = (Builder *)(in_RDI->_start + in_RDI->_pos);
      __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffb8);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffb8);
      memcpy(this_00,__src,sVar4);
      std::basic_string_view<char,_std::char_traits<char>_>::size
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffb8);
      advance(this_00,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    }
  }
  return in_RDI->_start + VVar1;
}

Assistant:

uint8_t* Builder::set(IStringFromParts const& parts) {
  // This method builds a single VPack String item composed of the 2 parts.
  auto const oldPos = _pos;

  checkKeyHasValidType(true);

  uint64_t length = parts.totalLength();
  if (length > 126) {
    // long string
    reserve(1 + 8 + length);
    appendByteUnchecked(0xbf);
    appendLengthUnchecked<8>(length);
  } else {
    // short string
    reserve(1 + length);
    appendByteUnchecked(static_cast<uint8_t>(0x40 + length));
  }
  for (std::size_t idx = 0, size = parts.numberOfParts(); idx != size; ++idx) {
    auto part = parts(idx);
    if (part.size() != 0) {
      std::memcpy(_start + _pos, part.data(), checkOverflow(part.size()));
      advance(part.size());
    }
  }
  return _start + oldPos;
}